

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O2

char * X86_group_name(csh handle,uint id)

{
  ulong uVar1;
  
  if (id - 6 < 0x7a || 0xa8 < id) {
    return (char *)0x0;
  }
  uVar1 = (ulong)(id - 0x7a);
  if (id < 0x80) {
    uVar1 = (ulong)id;
  }
  return group_name_maps[uVar1].name;
}

Assistant:

const char *X86_group_name(csh handle, unsigned int id)
{
#ifndef CAPSTONE_DIET
	// verify group id
	if (id >= X86_GRP_ENDING || (id > X86_GRP_IRET && id < X86_GRP_VM))
		return NULL;

	// NOTE: when new generic groups are added, 6 must be changed accordingly
	if (id >= 128)
		return group_name_maps[id - 128 + 6].name;
	else
		return group_name_maps[id].name;
#else
	return NULL;
#endif
}